

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_read_crg(opj_j2k_t *j2k)

{
  long in_RDI;
  int numcomps;
  opj_cio_t *cio;
  int Ycrg_i;
  int Xcrg_i;
  int i;
  int len;
  int n;
  opj_cio_t *cio_00;
  undefined4 local_10;
  
  cio_00 = *(opj_cio_t **)(in_RDI + 0x70);
  n = *(int *)(*(long *)(in_RDI + 0x58) + 0x10);
  cio_read(cio_00,n);
  for (local_10 = 0; local_10 < n; local_10 = local_10 + 1) {
    cio_read(cio_00,n);
    cio_read(cio_00,n);
  }
  return;
}

Assistant:

static void j2k_read_crg(opj_j2k_t *j2k) {
	int len, i, Xcrg_i, Ycrg_i;
	
	opj_cio_t *cio = j2k->cio;
	int numcomps = j2k->image->numcomps;
	
	len = cio_read(cio, 2);			/* Lcrg */
	for (i = 0; i < numcomps; i++) {
		Xcrg_i = cio_read(cio, 2);	/* Xcrg_i */
		Ycrg_i = cio_read(cio, 2);	/* Ycrg_i */
	}
}